

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_ObjComputeLevelR(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int i;
  int iVar5;
  
  i = 0;
  iVar5 = 0;
  while( true ) {
    pVVar4 = Vec_WecEntry(&p->vFanouts,iObj);
    if (pVVar4->nSize <= i) break;
    pVVar4 = Vec_WecEntry(&p->vFanouts,iObj);
    iVar1 = Vec_IntEntry(pVVar4,i);
    AVar2 = Acb_ObjType(p,iVar1);
    if (AVar2 != ABC_OPER_NONE) {
      iVar1 = Acb_ObjLevelR(p,iVar1);
      if (iVar5 <= iVar1) {
        iVar5 = iVar1;
      }
    }
    i = i + 1;
  }
  uVar3 = Acb_ObjIsCio(p,iObj);
  iVar5 = (uVar3 ^ 1) + iVar5;
  Vec_IntWriteEntry(&p->vLevelR,iObj,iVar5);
  return iVar5;
}

Assistant:

int Acb_ObjComputeLevelR( Acb_Ntk_t * p, int iObj )
{
    int iFanout, k, Level = 0;
    Acb_ObjForEachFanout( p, iObj, iFanout, k )
        Level = Abc_MaxInt( Level, Acb_ObjLevelR(p, iFanout) );
    return Acb_ObjSetLevelR( p, iObj, Level + !Acb_ObjIsCio(p, iObj) );
}